

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O1

void BrotliCompressFragmentTwoPassImpl17
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,uint32_t *command_buf,
               uint8_t *literal_buf,int *table,size_t *storage_ix,uint8_t *storage)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *input_size_00;
  long *plVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  undefined4 in_register_0000000c;
  uint32_t *commands;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long *plVar12;
  ulong uVar13;
  long *input_00;
  long *plVar14;
  long *__src;
  long *plVar15;
  uint uVar16;
  char *pcVar17;
  long *plVar18;
  ulong uVar19;
  uint32_t *puVar20;
  int *piVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  uint32_t *local_98;
  
  commands = (uint32_t *)CONCAT44(in_register_0000000c,is_last);
  input_00 = (long *)input;
  if (input_size != 0) {
    do {
      input_size_00 = (int *)0x20000;
      if (input_size < (int *)0x20000) {
        input_size_00 = (int *)input_size;
      }
      plVar4 = (long *)((long)input_size_00 + (long)input_00);
      __src = input_00;
      puVar20 = commands;
      local_98 = command_buf;
      if ((int *)0xf < input_size) {
        piVar21 = (int *)(input_size + -0x10);
        if ((int *)((long)input_size_00 + -6) < (int *)(input_size + -0x10)) {
          piVar21 = (int *)((long)input_size_00 + -6);
        }
        plVar18 = (long *)((long)piVar21 + (long)input_00);
        plVar14 = (long *)((long)input_00 + 1);
        uVar23 = (ulong)(*(long *)((long)input_00 + 1) * 0x1e35a7bd0000) >> 0x2f;
        iVar3 = -1;
        piVar21 = (int *)input_size;
LAB_0012b32f:
        uVar6 = 0x20;
        plVar12 = plVar14;
        do {
          plVar15 = (long *)((ulong)(uVar6 >> 5) + (long)plVar12);
          iVar22 = (int)input;
          iVar7 = (int)plVar12;
          if (plVar18 < plVar15) {
            iVar8 = 7;
          }
          else {
            uVar24 = (ulong)(*plVar15 * 0x1e35a7bd0000) >> 0x2f;
            if (((((int)*plVar12 == *(int *)((long)plVar12 + -(long)iVar3)) &&
                 (piVar21 = (int *)(-(long)iVar3 + (long)plVar12),
                 *(char *)((long)plVar12 + 4) == (char)piVar21[1])) &&
                (*(char *)((long)plVar12 + 5) == *(char *)((long)piVar21 + 5))) && (0 < iVar3)) {
              *(int *)(literal_buf + uVar23 * 4) = iVar7 - iVar22;
              iVar8 = 5;
              uVar23 = uVar24;
            }
            else {
              piVar21 = (int *)(input + *(int *)(literal_buf + uVar23 * 4));
              *(int *)(literal_buf + uVar23 * 4) = iVar7 - iVar22;
              iVar8 = 0;
              uVar23 = uVar24;
            }
          }
          if (iVar8 == 5) {
LAB_0012b3d6:
            if ((long)plVar12 - (long)piVar21 < 0x3fff1) goto LAB_0012b3f9;
          }
          else {
            plVar14 = plVar12;
            if (iVar8 != 0) goto LAB_0012b9ca;
            if ((((int)*plVar12 == *piVar21) && (*(char *)((long)plVar12 + 4) == (char)piVar21[1]))
               && (*(char *)((long)plVar12 + 5) == *(char *)((long)piVar21 + 5))) goto LAB_0012b3d6;
          }
          uVar6 = uVar6 + 1;
          plVar12 = plVar15;
        } while( true );
      }
LAB_0012ba12:
      if (__src < plVar4) {
        uVar6 = (uint)((long)plVar4 - (long)__src);
        if (5 < uVar6) {
          if (uVar6 < 0x82) {
            uVar6 = uVar6 - 2;
            uVar1 = 0x1f;
            if (uVar6 != 0) {
              for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
              }
            }
            bVar5 = (char)(uVar1 ^ 0xffffffe0) + 0x1f;
            uVar2 = uVar6 >> (bVar5 & 0x1f);
            uVar6 = (uVar6 - (uVar2 << (bVar5 & 0x1f))) * 0x100 |
                    uVar2 + (uVar1 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (uVar6 < 0x842) {
            uVar1 = 0x1f;
            if (uVar6 - 0x42 != 0) {
              for (; uVar6 - 0x42 >> uVar1 == 0; uVar1 = uVar1 - 1) {
              }
            }
            uVar6 = (((-1 << ((byte)uVar1 & 0x1f)) + uVar6 + -0x42) * 0x100 - (uVar1 ^ 0x1f)) + 0x29
            ;
          }
          else {
            iVar3 = uVar6 * 0x100;
            if (uVar6 < 0x1842) {
              uVar6 = iVar3 - 0x841eb;
            }
            else if (uVar6 < 0x5842) {
              uVar6 = iVar3 - 0x1841ea;
            }
            else {
              uVar6 = iVar3 - 0x5841e9;
            }
          }
        }
        *puVar20 = uVar6;
        puVar20 = puVar20 + 1;
        uVar23 = (long)plVar4 - (long)__src & 0xffffffff;
        memcpy(local_98,__src,uVar23);
        local_98 = (uint32_t *)((long)local_98 + uVar23);
      }
      iVar3 = ShouldCompress((uint8_t *)input_00,(size_t)input_size_00,
                             (long)local_98 - (long)command_buf);
      if (iVar3 == 0) {
        BrotliStoreMetaBlockHeader((size_t)input_size_00,1,(size_t *)table,(uint8_t *)storage_ix);
        iVar3 = *table;
        *(ulong *)table = (ulong)(iVar3 + 7U & 0xfffffff8);
        memcpy((void *)((ulong)(iVar3 + 7U >> 3) + (long)storage_ix),input_00,(size_t)input_size_00)
        ;
        uVar23 = (long)input_size_00 * 8 + *(long *)table;
        *(ulong *)table = uVar23;
        *(undefined1 *)((long)storage_ix + (uVar23 >> 3)) = 0;
      }
      else {
        BrotliStoreMetaBlockHeader((size_t)input_size_00,0,(size_t *)table,(uint8_t *)storage_ix);
        uVar23 = *(ulong *)table;
        uVar24 = uVar23 >> 3;
        *(ulong *)((long)storage_ix + uVar24) = (ulong)*(byte *)((long)storage_ix + uVar24);
        *(ulong *)table = uVar23 + 0xd;
        StoreCommands(m,(uint8_t *)command_buf,(long)local_98 - (long)command_buf,commands,
                      (long)puVar20 - (long)commands >> 2,(size_t *)table,(uint8_t *)storage_ix);
      }
      input_size = input_size - (long)input_size_00;
      input_00 = plVar4;
    } while ((int *)input_size != (int *)0x0);
  }
  return;
LAB_0012b3f9:
  uVar24 = (long)plVar4 + (-6 - (long)plVar12);
  if (7 < uVar24) {
    uVar9 = uVar24 & 0xfffffffffffffff8;
    pcVar17 = (char *)((long)plVar12 + uVar9 + 6);
    lVar10 = 0;
    uVar19 = 0;
LAB_0012b434:
    uVar11 = *(ulong *)((char *)((long)plVar12 + 6) + uVar19 * 8);
    uVar13 = *(ulong *)((long)piVar21 + uVar19 * 8 + 6);
    if (uVar11 == uVar13) goto code_r0x0012b442;
    uVar13 = uVar13 ^ uVar11;
    uVar24 = 0;
    if (uVar13 != 0) {
      for (; (uVar13 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
      }
    }
    uVar19 = (uVar24 >> 3 & 0x1fffffff) - lVar10;
    goto LAB_0012b473;
  }
  uVar9 = 0;
  pcVar17 = (char *)((long)plVar12 + 6);
LAB_0012b9d7:
  uVar24 = uVar24 & 7;
  uVar19 = uVar9;
  if (uVar24 != 0) {
    uVar11 = uVar9 | uVar24;
    do {
      uVar19 = uVar9;
      if (*(char *)((long)piVar21 + uVar9 + 6) != *pcVar17) break;
      pcVar17 = pcVar17 + 1;
      uVar9 = uVar9 + 1;
      uVar24 = uVar24 - 1;
      uVar19 = uVar11;
    } while (uVar24 != 0);
  }
LAB_0012b473:
  uVar1 = iVar7 - (int)__src;
  uVar6 = uVar1;
  if (5 < uVar1) {
    if (uVar1 < 0x82) {
      uVar2 = uVar1 - 2;
      uVar6 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      bVar5 = (char)(uVar6 ^ 0xffffffe0) + 0x1f;
      uVar16 = uVar2 >> (bVar5 & 0x1f);
      uVar6 = (uVar2 - (uVar16 << (bVar5 & 0x1f))) * 0x100 |
              uVar16 + (uVar6 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar1 < 0x842) {
      uVar6 = 0x1f;
      if (uVar1 - 0x42 != 0) {
        for (; uVar1 - 0x42 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = (((-1 << ((byte)uVar6 & 0x1f)) + uVar1 + -0x42) * 0x100 - (uVar6 ^ 0x1f)) + 0x29;
    }
    else {
      iVar7 = uVar1 * 0x100;
      if (uVar1 < 0x1842) {
        uVar6 = iVar7 - 0x841eb;
      }
      else if (uVar1 < 0x5842) {
        uVar6 = iVar7 - 0x1841ea;
      }
      else {
        uVar6 = iVar7 - 0x5841e9;
      }
    }
  }
  *puVar20 = uVar6;
  memcpy(local_98,__src,(long)(int)uVar1);
  uVar6 = 0x40;
  iVar7 = (int)((long)plVar12 - (long)piVar21);
  if (iVar3 != iVar7) {
    uVar2 = iVar7 + 3;
    uVar6 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    bVar5 = 0x1e - (char)(uVar6 ^ 0x1f);
    bVar25 = (uVar2 >> (bVar5 & 0x1f) & 1) != 0;
    uVar6 = (uint)bVar25 +
            ((uVar2 - (bVar25 + 2 << (bVar5 & 0x1f))) * 0x100 | (uVar6 ^ 0x1f) * 2 ^ 0x3e) + 0x4c;
    iVar3 = iVar7;
  }
  uVar24 = uVar19 + 6;
  puVar20[1] = uVar6;
  if (uVar24 < 0xc) {
    puVar20[2] = (int)uVar24 + 0x14;
    lVar10 = 0xc;
    goto LAB_0012b636;
  }
  if (uVar24 < 0x48) {
    uVar6 = 0x1f;
    uVar2 = (uint)(uVar19 - 2);
    if (uVar2 != 0) {
      for (; uVar2 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    bVar5 = (char)(uVar6 ^ 0xffffffe0) + 0x1f;
    uVar24 = uVar19 - 2 >> (bVar5 & 0x3f);
    puVar20[2] = (uVar2 - (int)(uVar24 << (bVar5 & 0x3f))) * 0x100 |
                 (int)uVar24 + (uVar6 ^ 0xffffffe0) * 2 + 0x5a;
    lVar10 = 0xc;
    goto LAB_0012b636;
  }
  if (uVar24 < 0x88) {
    uVar6 = ((uint)(uVar19 - 2) & 0x1f) << 8 | (int)(uVar19 - 2 >> 5) + 0x36U;
LAB_0012b625:
    puVar20[2] = uVar6;
  }
  else {
    if (0x847 < uVar24) {
      uVar6 = (int)uVar24 * 0x100 - 0x847c1;
      goto LAB_0012b625;
    }
    uVar6 = (int)uVar19 - 0x42;
    iVar7 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    puVar20[2] = ((int)(-1L << ((byte)iVar7 & 0x3f)) + (int)uVar19 + -0x42) * 0x100 + iVar7 + 0x34;
  }
  puVar20[3] = 0x40;
  lVar10 = 0x10;
LAB_0012b636:
  plVar14 = (long *)((long)plVar12 + uVar19 + 6);
  if (plVar14 < plVar18) {
    uVar24 = *(ulong *)((long)plVar12 + uVar19 + 1);
    iVar7 = (int)plVar14 - iVar22;
    *(int *)(literal_buf + (uVar24 * 0x1e35a7bd0000 >> 0x2f) * 4) = iVar7 + -5;
    *(int *)(literal_buf + ((uVar24 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x2f) * 4) = iVar7 + -4;
    *(int *)(literal_buf + ((uVar24 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x2f) * 4) = iVar7 + -3;
    uVar24 = *(ulong *)((long)plVar12 + uVar19 + 4);
    uVar9 = (uVar24 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x2f;
    *(int *)(literal_buf + (uVar24 * 0x1e35a7bd0000 >> 0x2f) * 4) = iVar7 + -2;
    *(int *)(literal_buf + ((uVar24 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x2f) * 4) = iVar7 + -1;
    piVar21 = (int *)(input + *(int *)(literal_buf + uVar9 * 4));
    *(int *)(literal_buf + uVar9 * 4) = iVar7;
    iVar8 = 0;
  }
  else {
    iVar8 = 7;
  }
  local_98 = (uint32_t *)((long)local_98 + (long)(int)uVar1);
  puVar20 = (uint32_t *)((long)puVar20 + lVar10);
  __src = plVar14;
  if (plVar14 < plVar18) {
    lVar10 = (long)plVar14 - (long)piVar21;
    if ((lVar10 < 0x3fff1) && ((int)*plVar14 == *piVar21)) {
      while ((*(char *)((long)__src + 4) == (char)piVar21[1] &&
             (*(char *)((long)__src + 5) == *(char *)((long)piVar21 + 5)))) {
        uVar24 = (long)plVar4 + (-6 - (long)__src);
        iVar3 = (int)lVar10;
        if (7 < uVar24) {
          uVar9 = uVar24 & 0xfffffffffffffff8;
          pcVar17 = (char *)((long)__src + uVar9 + 6);
          lVar10 = 0;
          uVar19 = 0;
LAB_0012b77c:
          uVar11 = *(ulong *)((char *)((long)__src + 6) + uVar19 * 8);
          uVar13 = *(ulong *)((long)piVar21 + uVar19 * 8 + 6);
          if (uVar11 == uVar13) goto code_r0x0012b78a;
          uVar13 = uVar13 ^ uVar11;
          uVar24 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
            }
          }
          uVar19 = (uVar24 >> 3 & 0x1fffffff) - lVar10;
          goto LAB_0012b7cf;
        }
        uVar9 = 0;
        pcVar17 = (char *)((long)__src + 6);
LAB_0012b96a:
        uVar24 = uVar24 & 7;
        uVar19 = uVar9;
        if (uVar24 != 0) {
          uVar11 = uVar9 | uVar24;
          do {
            uVar19 = uVar9;
            if (*(char *)((long)piVar21 + uVar9 + 6) != *pcVar17) break;
            pcVar17 = pcVar17 + 1;
            uVar9 = uVar9 + 1;
            uVar24 = uVar24 - 1;
            uVar19 = uVar11;
          } while (uVar24 != 0);
        }
LAB_0012b7cf:
        uVar24 = uVar19 + 6;
        if (uVar24 < 10) {
          uVar6 = (int)uVar24 + 0x26;
        }
        else {
          uVar6 = (uint)uVar19;
          if (uVar24 < 0x86) {
            uVar1 = 0x1f;
            if (uVar6 != 0) {
              for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
              }
            }
            bVar5 = (char)(uVar1 ^ 0xffffffe0) + 0x1f;
            uVar24 = uVar19 >> (bVar5 & 0x3f);
            uVar6 = (uVar6 - (int)(uVar24 << (bVar5 & 0x3f))) * 0x100 |
                    (int)uVar24 + (uVar1 ^ 0xffffffe0) * 2 + 0x6a;
          }
          else if (uVar24 < 0x846) {
            iVar7 = 0x1f;
            if (uVar6 - 0x40 != 0) {
              for (; uVar6 - 0x40 >> iVar7 == 0; iVar7 = iVar7 + -1) {
              }
            }
            uVar6 = iVar7 + ((int)(-1L << ((byte)iVar7 & 0x3f)) + uVar6 + -0x40) * 0x100 + 0x34;
          }
          else {
            uVar6 = (int)uVar24 * 0x100 - 0x845c1;
          }
        }
        plVar14 = (long *)((long)__src + uVar19 + 6);
        *puVar20 = uVar6;
        uVar1 = iVar3 + 3;
        uVar6 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        bVar5 = 0x1e - (char)(uVar6 ^ 0x1f);
        bVar25 = (uVar1 >> (bVar5 & 0x1f) & 1) != 0;
        puVar20[1] = (uint)bVar25 +
                     ((uVar1 - (bVar25 + 2 << (bVar5 & 0x1f))) * 0x100 | (uVar6 ^ 0x1f) * 2 ^ 0x3e)
                     + 0x4c;
        if (plVar14 < plVar18) {
          uVar24 = *(ulong *)((long)__src + uVar19 + 1);
          iVar7 = (int)plVar14 - iVar22;
          *(int *)(literal_buf + (uVar24 * 0x1e35a7bd0000 >> 0x2f) * 4) = iVar7 + -5;
          *(int *)(literal_buf + ((uVar24 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x2f) * 4) =
               iVar7 + -4;
          *(int *)(literal_buf + ((uVar24 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x2f) * 4) =
               iVar7 + -3;
          uVar24 = *(ulong *)((long)__src + uVar19 + 4);
          uVar9 = (uVar24 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x2f;
          *(int *)(literal_buf + (uVar24 * 0x1e35a7bd0000 >> 0x2f) * 4) = iVar7 + -2;
          *(int *)(literal_buf + ((uVar24 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x2f) * 4) =
               iVar7 + -1;
          piVar21 = (int *)(input + *(int *)(literal_buf + uVar9 * 4));
          *(int *)(literal_buf + uVar9 * 4) = iVar7;
          iVar8 = 0;
        }
        else {
          iVar8 = 7;
        }
        puVar20 = puVar20 + 2;
        __src = plVar14;
        if (plVar18 <= plVar14) goto LAB_0012b9ca;
        lVar10 = (long)plVar14 - (long)piVar21;
        if ((0x3fff0 < lVar10) || ((int)*plVar14 != *piVar21)) break;
      }
    }
    plVar14 = (long *)((long)__src + 1);
    uVar23 = (ulong)(*(long *)((long)__src + 1) * 0x1e35a7bd0000) >> 0x2f;
    iVar8 = 0;
  }
LAB_0012b9ca:
  if (iVar8 != 0) goto LAB_0012ba12;
  goto LAB_0012b32f;
code_r0x0012b442:
  uVar19 = uVar19 + 1;
  lVar10 = lVar10 + -8;
  if (uVar24 >> 3 == uVar19) goto LAB_0012b9d7;
  goto LAB_0012b434;
code_r0x0012b78a:
  uVar19 = uVar19 + 1;
  lVar10 = lVar10 + -8;
  if (uVar24 >> 3 == uVar19) goto LAB_0012b96a;
  goto LAB_0012b77c;
}

Assistant:

void BrotliCompressFragmentTwoPass(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          m, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}